

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O1

void __thiscall
slang::ast::SignalEventControl::serializeTo(SignalEventControl *this,ASTSerializer *serializer)

{
  size_t __n;
  
  ASTSerializer::write(serializer,4,"expr",(size_t)this->expr);
  __n = strlen(*(char **)(toString(slang::ast::EdgeKind)::strings + (long)(int)this->edge * 8));
  ASTSerializer::write(serializer,4,"edge",__n);
  if (this->iffCondition != (Expression *)0x0) {
    ASTSerializer::write(serializer,3,"iff",(size_t)this->iffCondition);
    return;
  }
  return;
}

Assistant:

void SignalEventControl::serializeTo(ASTSerializer& serializer) const {
    serializer.write("expr", expr);
    serializer.write("edge", toString(edge));

    if (iffCondition)
        serializer.write("iff", *iffCondition);
}